

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

void __thiscall MemoryAccountant::clear(MemoryAccountant *this)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  
  pMVar2 = this->head_;
  while (pMVar2 != (MemoryAccountantAllocationNode *)0x0) {
    pMVar1 = pMVar2->next_;
    (*this->allocator_->_vptr_TestMemoryAllocator[3])
              (this->allocator_,pMVar2,8,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x1a5);
    pMVar2 = pMVar1;
  }
  this->head_ = (MemoryAccountantAllocationNode *)0x0;
  return;
}

Assistant:

void MemoryAccountant::clear()
{
    MemoryAccountantAllocationNode* node = head_;
    MemoryAccountantAllocationNode* to_be_deleted = NULLPTR;
    while (node) {
        to_be_deleted = node;
        node = node->next_;
        destroyAccountantAllocationNode(to_be_deleted);
    }
    head_ = NULLPTR;
}